

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPathCommand.cxx
# Opt level: O2

string * __thiscall
cmFindPathCommand::FindNormalHeader_abi_cxx11_
          (string *__return_storage_ptr__,cmFindPathCommand *this,cmFindBaseDebugState *debug)

{
  pointer pbVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path;
  pointer a;
  pointer b;
  string tryPath;
  string local_b8;
  pointer local_98;
  string local_90;
  string local_70;
  string local_50;
  
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  b = (this->super_cmFindBase).Names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start;
  local_98 = (this->super_cmFindBase).Names.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (b == local_98) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_50);
LAB_002fe816:
      std::__cxx11::string::~string((string *)&local_b8);
      return __return_storage_ptr__;
    }
    pbVar1 = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (a = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; a != pbVar1; a = a + 1) {
      cmStrCat<std::__cxx11::string_const&,std::__cxx11::string_const&>(&local_50,a,b);
      std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      bVar2 = cmsys::SystemTools::FileExists(&local_b8);
      if (bVar2) {
        path = a;
        if (this->IncludeFileInPath != false) {
          path = &local_b8;
        }
        bVar2 = cmFindBase::Validate(&this->super_cmFindBase,path);
        if (bVar2) {
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          local_70._M_string_length = 0;
          local_70.field_2._M_local_buf[0] = '\0';
          cmFindBaseDebugState::FoundAt(debug,&local_b8,&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          if (this->IncludeFileInPath == true) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p == &local_b8.field_2) {
              (__return_storage_ptr__->field_2)._M_allocated_capacity =
                   CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                            local_b8.field_2._M_local_buf[0]);
              *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_b8.field_2._8_8_;
            }
            else {
              (__return_storage_ptr__->_M_dataplus)._M_p = local_b8._M_dataplus._M_p;
              (__return_storage_ptr__->field_2)._M_allocated_capacity =
                   CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                            local_b8.field_2._M_local_buf[0]);
            }
            __return_storage_ptr__->_M_string_length = local_b8._M_string_length;
            local_b8._M_string_length = 0;
            local_b8.field_2._M_local_buf[0] = '\0';
            local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          }
          else {
            std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)a);
          }
          goto LAB_002fe816;
        }
      }
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      local_90._M_string_length = 0;
      local_90.field_2._M_local_buf[0] = '\0';
      cmFindBaseDebugState::FailedAt(debug,&local_b8,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
    }
    b = b + 1;
  } while( true );
}

Assistant:

std::string cmFindPathCommand::FindNormalHeader(cmFindBaseDebugState& debug)
{
  std::string tryPath;
  for (std::string const& n : this->Names) {
    for (std::string const& sp : this->SearchPaths) {
      tryPath = cmStrCat(sp, n);
      if (cmSystemTools::FileExists(tryPath) &&
          this->Validate(this->IncludeFileInPath ? tryPath : sp)) {
        debug.FoundAt(tryPath);
        if (this->IncludeFileInPath) {
          return tryPath;
        }
        return sp;
      }
      debug.FailedAt(tryPath);
    }
  }
  return "";
}